

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O1

void __thiscall
Equality_unitsEqualDifferingOrderOfUnitsManyUnit_Test::TestBody
          (Equality_unitsEqualDifferingOrderOfUnitsManyUnit_Test *this)

{
  string *psVar1;
  undefined1 uVar2;
  char cVar3;
  AssertionResult gtest_ar_;
  UnitsPtr u2;
  UnitsPtr u1;
  AssertionResult local_a8;
  long local_98 [2];
  long *local_88;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  long local_78 [2];
  AssertHelper local_68 [8];
  long *local_60 [2];
  long local_50 [2];
  string *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  string *local_30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  
  local_a8._0_8_ = (string *)local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"unitsA","");
  libcellml::Units::create((string *)&local_30);
  if ((string *)local_a8._0_8_ != (string *)local_98) {
    operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
  }
  local_a8._0_8_ = (string *)local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"unitsA","");
  libcellml::Units::create((string *)&local_40);
  if ((string *)local_a8._0_8_ != (string *)local_98) {
    operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
  }
  psVar1 = local_30;
  local_a8._0_8_ = (string *)local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"second","");
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"unit_id","");
  libcellml::Units::addUnit(psVar1,1.0,(string *)&local_a8);
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  if ((string *)local_a8._0_8_ != (string *)local_98) {
    operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
  }
  psVar1 = local_30;
  local_a8._0_8_ = (string *)local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"metre","");
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"");
  libcellml::Units::addUnit(psVar1,3.0,(string *)&local_a8);
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  if ((string *)local_a8._0_8_ != (string *)local_98) {
    operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
  }
  psVar1 = local_30;
  local_a8._0_8_ = (string *)local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"apple","");
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"");
  libcellml::Units::addUnit(psVar1,1.0,(string *)&local_a8);
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  if ((string *)local_a8._0_8_ != (string *)local_98) {
    operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
  }
  psVar1 = local_30;
  local_a8._0_8_ = (string *)local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"jedi","");
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"yota","");
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"");
  libcellml::Units::addUnit(psVar1,(string *)&local_a8,-2.0,1.0,(string *)&local_88);
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] + 1);
  }
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  if ((string *)local_a8._0_8_ != (string *)local_98) {
    operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
  }
  psVar1 = local_30;
  local_a8._0_8_ = (string *)local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"flip","");
  libcellml::Units::addUnit(psVar1);
  if ((string *)local_a8._0_8_ != (string *)local_98) {
    operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
  }
  psVar1 = local_30;
  local_a8._0_8_ = (string *)local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"lumen","");
  libcellml::Units::addUnit(psVar1);
  if ((string *)local_a8._0_8_ != (string *)local_98) {
    operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
  }
  psVar1 = local_40;
  local_a8._0_8_ = (string *)local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"jedi","");
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"yota","");
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"");
  libcellml::Units::addUnit(psVar1,(string *)&local_a8,-2.0,1.0,(string *)&local_88);
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] + 1);
  }
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  if ((string *)local_a8._0_8_ != (string *)local_98) {
    operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
  }
  psVar1 = local_40;
  local_a8._0_8_ = (string *)local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"second","");
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"unit_id","");
  libcellml::Units::addUnit(psVar1,1.0,(string *)&local_a8);
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  if ((string *)local_a8._0_8_ != (string *)local_98) {
    operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
  }
  psVar1 = local_40;
  local_a8._0_8_ = (string *)local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"lumen","");
  libcellml::Units::addUnit(psVar1);
  if ((string *)local_a8._0_8_ != (string *)local_98) {
    operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
  }
  psVar1 = local_40;
  local_a8._0_8_ = (string *)local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"metre","");
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"");
  libcellml::Units::addUnit(psVar1,3.0,(string *)&local_a8);
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  if ((string *)local_a8._0_8_ != (string *)local_98) {
    operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
  }
  psVar1 = local_40;
  local_a8._0_8_ = (string *)local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"apple","");
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"");
  libcellml::Units::addUnit(psVar1,1.0,(string *)&local_a8);
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  if ((string *)local_a8._0_8_ != (string *)local_98) {
    operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
  }
  psVar1 = local_40;
  local_a8._0_8_ = (string *)local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"flip","");
  libcellml::Units::addUnit(psVar1);
  if ((string *)local_a8._0_8_ != (string *)local_98) {
    operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
  }
  local_a8._0_8_ = local_40;
  local_a8.message_.ptr_ = local_38;
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&local_38->_M_string_length = (int)local_38->_M_string_length + 1;
      UNLOCK();
    }
    else {
      *(int *)&local_38->_M_string_length = (int)local_38->_M_string_length + 1;
    }
  }
  uVar2 = libcellml::Entity::equals((shared_ptr *)local_30);
  local_88 = (long *)CONCAT71(local_88._1_7_,uVar2);
  local_80.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_a8.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.message_.ptr_);
  }
  if (local_88._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,(char *)&local_88,"u1->equals(u2)","false");
    testing::internal::AssertHelper::AssertHelper
              (local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
               ,0x146,(char *)local_a8._0_8_);
    testing::internal::AssertHelper::operator=(local_68,(Message *)local_60);
    testing::internal::AssertHelper::~AssertHelper(local_68);
    if ((string *)local_a8._0_8_ != (string *)local_98) {
      operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
    }
    if (local_60[0] != (long *)0x0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') && (local_60[0] != (long *)0x0)) {
        (**(code **)(*local_60[0] + 8))();
      }
      local_60[0] = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_a8._0_8_ = local_30;
  local_a8.message_.ptr_ = local_28;
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&local_28->_M_string_length = (int)local_28->_M_string_length + 1;
      UNLOCK();
    }
    else {
      *(int *)&local_28->_M_string_length = (int)local_28->_M_string_length + 1;
    }
  }
  uVar2 = libcellml::Entity::equals((shared_ptr *)local_40);
  local_88 = (long *)CONCAT71(local_88._1_7_,uVar2);
  local_80.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_a8.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.message_.ptr_);
  }
  if (local_88._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,(char *)&local_88,"u2->equals(u1)","false");
    testing::internal::AssertHelper::AssertHelper
              (local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
               ,0x147,(char *)local_a8._0_8_);
    testing::internal::AssertHelper::operator=(local_68,(Message *)local_60);
    testing::internal::AssertHelper::~AssertHelper(local_68);
    if ((string *)local_a8._0_8_ != (string *)local_98) {
      operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
    }
    if (local_60[0] != (long *)0x0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') && (local_60[0] != (long *)0x0)) {
        (**(code **)(*local_60[0] + 8))();
      }
      local_60[0] = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28);
  }
  return;
}

Assistant:

TEST(Equality, unitsNotEqualByUnitIdOnly)
{
    libcellml::UnitsPtr u1 = libcellml::Units::create("unitsA");
    libcellml::UnitsPtr u2 = libcellml::Units::create("unitsA");

    u1->addUnit("second");
    u2->addUnit("second");

    u1->setUnitId(0, "UnitsASecond");

    EXPECT_NE(u1, u2);
    EXPECT_FALSE(u1->equals(u2));
    EXPECT_FALSE(u2->equals(u1));
    EXPECT_TRUE(libcellml::Units::equivalent(u1, u2));
}